

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

block_id_t __thiscall duckdb::SingleFileBlockManager::GetFreeBlockId(SingleFileBlockManager *this)

{
  const_iterator __position;
  int iVar1;
  long lVar2;
  pair<std::_Rb_tree_iterator<long>,_std::_Rb_tree_iterator<long>_> pVar3;
  long local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar1 == 0) {
    if ((this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      lVar2 = this->max_block;
      this->max_block = lVar2 + 1;
    }
    else {
      __position._M_node = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_20 = *(long *)(__position._M_node + 1);
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&this->free_list,__position);
      pVar3 = ::std::
              _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
              equal_range(&(this->newly_freed_list)._M_t,&local_20);
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_erase_aux(&(this->newly_freed_list)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
      lVar2 = local_20;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return lVar2;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

block_id_t SingleFileBlockManager::GetFreeBlockId() {
	lock_guard<mutex> lock(block_lock);
	block_id_t block;
	if (!free_list.empty()) {
		// The free list is not empty, so we take its first element.
		block = *free_list.begin();
		// erase the entry from the free list again
		free_list.erase(free_list.begin());
		newly_freed_list.erase(block);
	} else {
		block = max_block++;
	}
	return block;
}